

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::student_t_dist<float>::icdf_(student_t_dist<float> *this,result_type_conflict1 x)

{
  int iVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  result_type_conflict1 t;
  float in_stack_ffffffffffffffdc;
  
  iVar1 = param_type::nu(in_RDI);
  fVar2 = (float)iVar1 / 2.0;
  param_type::nu(in_RDI);
  fVar2 = math::inv_Beta_I(fVar2,in_XMM0_Da,in_stack_ffffffffffffffdc);
  iVar1 = param_type::nu(in_RDI);
  dVar3 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,(float)iVar1 / (fVar2 * (1.0 - fVar2))));
  return SUB84(dVar3,0) * (fVar2 - 0.5);
}

Assistant:

icdf_(result_type x) const {
      const result_type t{
          math::inv_Beta_I(x, P.nu() / result_type(2), P.nu() / result_type(2))};
      return math::sqrt(P.nu() / (t * (1 - t))) * (t - result_type(1) / result_type(2));
    }